

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O2

void __thiscall Party::Party(Party *this,World *world,Character *leader,Character *other)

{
  Character *other_local;
  Character *leader_local;
  Party *local_18;
  
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->world = world;
  other_local = other;
  leader_local = leader;
  local_18 = this;
  std::vector<Party*,std::allocator<Party*>>::emplace_back<Party*>
            ((vector<Party*,std::allocator<Party*>> *)&world->parties,&local_18);
  std::vector<Character_*,_std::allocator<Character_*>_>::push_back(&this->members,&leader_local);
  std::vector<Character_*,_std::allocator<Character_*>_>::push_back(&this->members,&other_local);
  this->leader = leader_local;
  leader_local->party = this;
  other_local->party = this;
  this->temp_expsum = 0;
  RefreshMembers(this,leader_local,true);
  RefreshMembers(this,other_local,true);
  return;
}

Assistant:

Party::Party(World *world, Character *leader, Character *other)
{
	this->world = world;
	this->world->parties.push_back(this);

	this->members.push_back(leader);
	this->members.push_back(other);

	this->leader = leader;

	leader->party = this;
	other->party = this;

	this->temp_expsum = 0;

	this->RefreshMembers(leader, true);
	this->RefreshMembers(other, true);
}